

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O0

string * absl::StrCat<std::__cxx11::string,char[2],std::__cxx11::string>
                   (string_view first,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest,
                   char (*rest_1) [2],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest_2)

{
  string_view str;
  string_view first_00;
  string *in_RCX;
  char *in_RSI;
  string *in_RDI;
  char *in_R8;
  size_t in_R9;
  string local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  string local_50 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char (*in_stack_ffffffffffffffc8) [2];
  
  str._M_str = in_RSI;
  str._M_len = in_stack_ffffffffffffff90;
  StrCat_abi_cxx11_(str);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_RCX);
  first_00._M_str = in_R8;
  first_00._M_len = in_R9;
  StrCat<char[2],std::__cxx11::string>(first_00,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0)
  ;
  std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_50);
  return in_RDI;
}

Assistant:

inline std::string StrCat(absl::string_view first, const T &...rest) {
  return StrCat(first) + StrCat(rest...);
}